

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O3

void ncnn::convdw3x3s2_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Option *opt)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  void *pvVar14;
  size_t sVar15;
  size_t sVar16;
  void *pvVar17;
  size_t sVar18;
  size_t sVar19;
  int iVar20;
  int size;
  uint uVar21;
  char *pcVar22;
  char *pcVar23;
  long lVar24;
  char *pcVar25;
  int iVar26;
  long lVar27;
  int *piVar28;
  
  iVar10 = top_blob->c;
  if (0 < (long)iVar10) {
    iVar11 = top_blob->w;
    iVar12 = top_blob->h;
    iVar13 = bottom_blob->w;
    iVar20 = (iVar13 - iVar11) * 2;
    pvVar14 = top_blob->data;
    sVar15 = top_blob->cstep;
    sVar16 = top_blob->elemsize;
    pvVar17 = bottom_blob->data;
    sVar18 = bottom_blob->cstep;
    sVar19 = bottom_blob->elemsize;
    lVar24 = 0;
    do {
      lVar27 = sVar15 * sVar16 * lVar24;
      uVar21 = top_blob->h * top_blob->w;
      if (0 < (int)uVar21) {
        memset((void *)((long)pvVar14 + lVar27),0,(ulong)uVar21 << 2);
      }
      if (0 < iVar12) {
        piVar28 = (int *)(lVar27 + (long)pvVar14);
        lVar27 = lVar24 * 9;
        pcVar22 = (char *)(sVar18 * sVar19 * lVar24 + (long)pvVar17);
        pcVar23 = pcVar22 + (long)iVar13 * 2;
        pcVar25 = pcVar22 + iVar13;
        iVar26 = 0;
        do {
          uVar21 = iVar11 + 1;
          if (0 < iVar11) {
            do {
              cVar7 = *pcVar22;
              pcVar1 = pcVar22 + 1;
              pcVar2 = pcVar22 + 2;
              pcVar22 = pcVar22 + 2;
              cVar8 = *pcVar25;
              pcVar3 = pcVar25 + 1;
              pcVar4 = pcVar25 + 2;
              pcVar25 = pcVar25 + 2;
              cVar9 = *pcVar23;
              pcVar5 = pcVar23 + 1;
              pcVar6 = pcVar23 + 2;
              pcVar23 = pcVar23 + 2;
              *piVar28 = (int)*(char *)((long)&_kernel->data + lVar27 + 7) * (int)*pcVar5 +
                         (int)*(char *)((long)&_kernel->data + lVar27 + 6) * (int)cVar9 +
                         (int)*(char *)((long)&_kernel->data + lVar27 + 5) * (int)*pcVar4 +
                         (int)*(char *)((long)&_kernel->data + lVar27 + 4) * (int)*pcVar3 +
                         (int)*(char *)((long)&_kernel->data + lVar27 + 3) * (int)cVar8 +
                         (int)*(char *)((long)&_kernel->data + lVar27 + 2) * (int)*pcVar2 +
                         (int)*(char *)((long)&_kernel->data + lVar27 + 1) * (int)*pcVar1 +
                         (int)*(char *)((long)&_kernel->data + lVar27) * (int)cVar7 + *piVar28 +
                         (int)*(char *)((long)&_kernel->refcount + lVar27) * (int)*pcVar6;
              piVar28 = piVar28 + 1;
              uVar21 = uVar21 - 1;
            } while (1 < uVar21);
          }
          pcVar22 = pcVar22 + iVar20;
          pcVar25 = pcVar25 + iVar20;
          pcVar23 = pcVar23 + iVar20;
          iVar26 = iVar26 + 1;
        } while (iVar26 != iVar12);
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 != iVar10);
  }
  return;
}

Assistant:

static void convdw3x3s2_int8_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const signed char *kernel = _kernel;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        out.fill(0);

        const signed char *kernel0 = (const signed char *)kernel + p * 9;

        int *outptr = out;

        const signed char *img0 = bottom_blob.channel(p);

        const signed char *r0 = img0;
        const signed char *r1 = img0 + w;
        const signed char *r2 = img0 + w * 2;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr += sum;

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}